

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  snd_pcm_state_t sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pthread_t __thread1;
  char *errorText;
  void *local_78;
  int __pa_unsure_error_id;
  snd_pcm_uframes_t hwAvail;
  undefined8 uStack_58;
  int xrun;
  snd_pcm_t *save;
  void *userBuffer;
  snd_pcm_uframes_t framesAvail;
  snd_pcm_uframes_t framesGot;
  PaAlsaStream *stream;
  long err;
  void *pvStack_20;
  PaError result;
  unsigned_long frames_local;
  void *buffer_local;
  PaStream *s_local;
  
  err._4_4_ = 0;
  uStack_58 = *(undefined8 *)((long)s + 0x2c0);
  framesGot = (snd_pcm_uframes_t)s;
  pvStack_20 = (void *)frames;
  frames_local = (unsigned_long)buffer;
  buffer_local = s;
  if (s == (PaStream *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x114d,"PaError WriteStream(PaStream *, const void *, unsigned long)");
  }
  if (*(long *)((long)s + 0x340) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4431\n"
                     );
    err._4_4_ = -0x26f6;
  }
  else {
    *(undefined8 *)((long)s + 0x2c0) = 0;
    if (0.0 < *(double *)((long)s + 0x278)) {
      err._4_4_ = -0x26fc;
      *(undefined8 *)((long)s + 0x278) = 0;
    }
    save = (snd_pcm_t *)buffer;
    if (*(int *)((long)s + 0x318) == 0) {
      save = *(snd_pcm_t **)((long)s + 0x368);
      memcpy(save,buffer,(long)*(int *)((long)s + 0x310) << 3);
    }
    do {
      if (pvStack_20 == (void *)0x0) goto LAB_0010b514;
      hwAvail._4_4_ = 0;
      paUtilErr_ = PaAlsaStream_WaitForFrames
                             ((PaAlsaStream *)framesGot,(unsigned_long *)&userBuffer,
                              (int *)((long)&hwAvail + 4));
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4455\n"
                         );
        err._4_4_ = paUtilErr_;
        goto LAB_0010b514;
      }
      if (userBuffer < pvStack_20) {
        local_78 = userBuffer;
      }
      else {
        local_78 = pvStack_20;
      }
      framesAvail = (snd_pcm_uframes_t)local_78;
      paUtilErr_ = PaAlsaStream_SetUpBuffers
                             ((PaAlsaStream *)framesGot,&framesAvail,(int *)((long)&hwAvail + 4));
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4458\n"
                         );
        err._4_4_ = paUtilErr_;
        goto LAB_0010b514;
      }
      if (framesAvail != 0) {
        framesAvail = PaUtil_CopyOutput((PaUtilBufferProcessor *)(framesGot + 0x68),&save,
                                        framesAvail);
        paUtilErr_ = PaAlsaStream_EndProcessing
                               ((PaAlsaStream *)framesGot,framesAvail,(int *)((long)&hwAvail + 4));
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4462\n"
                           );
          err._4_4_ = paUtilErr_;
          goto LAB_0010b514;
        }
        pvStack_20 = (void *)((long)pvStack_20 - framesAvail);
      }
      stream = (PaAlsaStream *)GetStreamWriteAvailable((PaStream *)framesGot);
      paUtilErr_ = (PaError)stream;
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'err = GetStreamWriteAvailable( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4469\n"
                         );
        err._4_4_ = paUtilErr_;
        goto LAB_0010b514;
      }
      uVar4 = *(long *)(framesGot + 0x350) - (long)stream;
      userBuffer = stream;
      sVar1 = (*alsa_snd_pcm_state)(*(snd_pcm_t **)(framesGot + 0x340));
    } while (((sVar1 != SND_PCM_STATE_PREPARED) || (uVar4 < *(ulong *)(framesGot + 0x348))) ||
            (iVar2 = (*(code *)alsa_snd_pcm_start)(*(undefined8 *)(framesGot + 0x340)), -1 < iVar2))
    ;
    __thread1 = pthread_self();
    iVar3 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar3 != 0) {
      errorText = (*alsa_snd_strerror)(iVar2);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4476\n"
                     );
    err._4_4_ = -9999;
  }
LAB_0010b514:
  *(undefined8 *)(framesGot + 0x2c0) = uStack_58;
  return err._4_4_;
}

Assistant:

static PaError WriteStream( PaStream* s, const void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    signed long err;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    snd_pcm_uframes_t framesGot, framesAvail;
    const void *userBuffer;
    snd_pcm_t *save = stream->capture.pcm;

    assert( stream );

    PA_UNLESS( stream->playback.pcm, paCanNotWriteToAnInputOnlyStream );

    /* Disregard capture */
    stream->capture.pcm = NULL;

    if( stream->underrun > 0. )
    {
        result = paOutputUnderflowed;
        stream->underrun = 0.0;
    }

    if( stream->playback.userInterleaved )
        userBuffer = buffer;
    else /* Copy channels into local array */
    {
        userBuffer = stream->playback.userBuffers;
        memcpy( (void *)userBuffer, buffer, sizeof (void *) * stream->playback.numUserChannels );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        snd_pcm_uframes_t hwAvail;

        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyOutput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }

        /* Start stream after one period of samples worth */

        /* Frames residing in buffer */
        PA_ENSURE( err = GetStreamWriteAvailable( stream ) );
        framesAvail = err;
        hwAvail = stream->playback.alsaBufferSize - framesAvail;

        if( alsa_snd_pcm_state( stream->playback.pcm ) == SND_PCM_STATE_PREPARED &&
                hwAvail >= stream->playback.framesPerPeriod )
        {
            ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
    }

end:
    stream->capture.pcm = save;
    return result;
error:
    goto end;
}